

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::~LargeHeapBlock(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *allocator;
  undefined8 *in_FS_OFFSET;
  LargeHeapBlock *this_local;
  
  if ((this->super_HeapBlock).segment != (Segment *)0x0) {
    bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsClosed((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                        *)&this->heapInfo->recyclerLargeBlockPageAllocator);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0xd2,
                         "(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed())"
                         ,"ReleasePages needs to be called before delete");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  if (this->pageHeapData != (PageHeapData *)0x0) {
    allocator = HeapAllocator::GetNoMemProtectInstance();
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::PageHeapData>
              (allocator,this->pageHeapData);
    this->pageHeapData = (PageHeapData *)0x0;
  }
  BVSparse<Memory::HeapAllocator>::~BVSparse(&this->wbVerifyBits);
  return;
}

Assistant:

LargeHeapBlock::~LargeHeapBlock()
{
    AssertMsg(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed(),
        "ReleasePages needs to be called before delete");
    RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockCount);

#ifdef RECYCLER_PAGE_HEAP
    if (pageHeapData)
    {
        NoMemProtectHeapDelete(pageHeapData);
        pageHeapData = nullptr;
    }
#endif
}